

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_entry.hpp
# Opt level: O0

void __thiscall libtorrent::lazy_entry::swap(lazy_entry *this,lazy_entry *e)

{
  uint uVar1;
  uint32_t tmp;
  lazy_entry *e_local;
  lazy_entry *this_local;
  
  uVar1 = *(uint *)&e->field_0x14;
  *(uint *)&e->field_0x14 =
       *(uint *)&e->field_0x14 & 0x1fffffff | *(uint *)&this->field_0x14 & 0xe0000000;
  *(uint *)&this->field_0x14 = *(uint *)&this->field_0x14 & 0x1fffffff | uVar1 & 0xe0000000;
  uVar1 = *(uint *)&e->field_0x14;
  *(uint *)&e->field_0x14 =
       *(uint *)&e->field_0x14 & 0xe0000000 | *(uint *)&this->field_0x14 & 0x1fffffff;
  *(uint *)&this->field_0x14 = *(uint *)&this->field_0x14 & 0xe0000000 | uVar1 & 0x1fffffff;
  std::swap<char_const*>((char **)this,(char **)e);
  std::swap<char_const*>(&this->m_begin,&e->m_begin);
  std::swap<unsigned_int>(&this->m_len,&e->m_len);
  return;
}

Assistant:

void swap(lazy_entry& e)
		{
			using std::swap;
			std::uint32_t tmp = e.m_type;
			e.m_type = m_type;
			m_type = tmp;
			tmp = e.m_size;
			e.m_size = m_size;
			m_size = tmp;
			swap(m_data.start, e.m_data.start);
			swap(m_begin, e.m_begin);
			swap(m_len, e.m_len);
		}